

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderUniformTest::prepareNextTestCase
          (QualifierOrderUniformTest *this,GLuint test_case_index)

{
  TestContext *this_00;
  TestLog *this_01;
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  MessageBuilder *this_02;
  GLchar *local_1b8;
  uint local_1ac;
  undefined1 local_1a8 [4];
  GLuint i;
  MessageBuilder message;
  qualifierSet *set;
  GLuint test_case_index_local;
  QualifierOrderUniformTest *this_local;
  
  this->m_current_test_case_index = test_case_index;
  if ((test_case_index == 0xffffffff) ||
     (sVar2 = std::
              vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
              ::size(&this->m_test_cases), test_case_index < sVar2)) {
    message.m_str._368_8_ = getCurrentTestCase(this);
    this_00 = deqp::Context::getTestContext
                        ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    for (local_1ac = 0; uVar1 = (ulong)local_1ac,
        sVar2 = std::
                vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ::size((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                        *)message.m_str._368_8_), uVar1 < sVar2; local_1ac = local_1ac + 1) {
      pvVar3 = std::
               vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ::operator[]((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                             *)message.m_str._368_8_,(ulong)local_1ac);
      local_1b8 = Utils::getQualifierString(*pvVar3);
      this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&local_1b8);
      tcu::MessageBuilder::operator<<(this_02,(char (*) [2])0x2c7b4d6);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    this_local._7_1_ = true;
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a8);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool QualifierOrderUniformTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		/* Nothing to be done here */;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const Utils::qualifierSet& set = getCurrentTestCase();

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	for (GLuint i = 0; i < set.size(); ++i)
	{
		message << Utils::getQualifierString(set[i]) << " ";
	}

	message << tcu::TestLog::EndMessage;

	return true;
}